

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_CDict *
ZSTD_createCDict_advanced
          (void *dictBuffer,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_compressionParameters cParams,
          ZSTD_customMem customMem)

{
  ZSTD_CDict *pZVar1;
  ZSTD_CCtx_params cctxParams;
  void *in_stack_00000158;
  undefined1 in_stack_00000170 [24];
  ZSTD_CCtx_params *in_stack_fffffffffffffee8;
  undefined1 local_e8 [232];
  
  memset(local_e8,0,0xd0);
  ZSTD_CCtxParams_init(in_stack_fffffffffffffee8,0);
  pZVar1 = ZSTD_createCDict_advanced2
                     (in_stack_00000158,(size_t)customMem.opaque,customMem.customFree._4_4_,
                      (ZSTD_dictContentType_e)customMem.customFree,
                      (ZSTD_CCtx_params *)customMem.customAlloc,(ZSTD_customMem)in_stack_00000170);
  return pZVar1;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced(const void* dictBuffer, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_compressionParameters cParams,
                                      ZSTD_customMem customMem)
{
    ZSTD_CCtx_params cctxParams;
    ZSTD_memset(&cctxParams, 0, sizeof(cctxParams));
    ZSTD_CCtxParams_init(&cctxParams, 0);
    cctxParams.cParams = cParams;
    cctxParams.customMem = customMem;
    return ZSTD_createCDict_advanced2(
        dictBuffer, dictSize,
        dictLoadMethod, dictContentType,
        &cctxParams, customMem);
}